

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::fuse_convolutiondepthwise_activation(NetOptimize *this)

{
  Mat *pMVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  pointer ppLVar4;
  Layer *pLVar5;
  void *pvVar6;
  long *plVar7;
  undefined4 *puVar8;
  string *psVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  Mat local_88;
  string *local_40;
  long local_38;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar15 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar15 != 0) {
    uVar16 = lVar15 >> 3;
    lVar15 = uVar16 + (uVar16 == 0);
    lVar14 = 0;
    local_38 = lVar15;
    do {
      iVar10 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar14]->type);
      if (iVar10 == 0) {
        uVar13 = lVar14 + 1;
        if (uVar13 < uVar16) {
          iVar10 = *((((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar14]->tops).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          do {
            iVar11 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar13]->type);
            if (((((iVar11 == 0) ||
                  (iVar11 = std::__cxx11::string::compare
                                      ((char *)&(((this->super_ModelWriter).layers)->
                                                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                                )._M_impl.super__Vector_impl_data._M_start[uVar13]->
                                                type), iVar11 == 0)) ||
                 (iVar11 = std::__cxx11::string::compare
                                     ((char *)&(((this->super_ModelWriter).layers)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar13]->
                                               type), iVar11 == 0)) ||
                ((iVar11 = std::__cxx11::string::compare
                                     ((char *)&(((this->super_ModelWriter).layers)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar13]->
                                               type), iVar11 == 0 ||
                 (iVar11 = std::__cxx11::string::compare
                                     ((char *)&(((this->super_ModelWriter).layers)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar13]->
                                               type), iVar11 == 0)))) &&
               ((pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar13],
                piVar12 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar12 == 4 &&
                (lVar15 = local_38, *piVar12 == iVar10)))) goto LAB_00166ea5;
            uVar13 = uVar13 + 1;
            lVar15 = local_38;
          } while (uVar13 < uVar16);
        }
        else {
LAB_00166ea5:
          if (uVar13 != uVar16) {
            ppLVar4 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar3 = ppLVar4[lVar14];
            pLVar5 = ppLVar4[uVar13];
            fprintf(_stderr,"fuse_convolutiondepthwise_activation %s %s\n",
                    (pLVar3->name)._M_dataplus._M_p);
            local_40 = &pLVar5->type;
            iVar10 = std::__cxx11::string::compare((char *)local_40);
            psVar9 = local_40;
            if (iVar10 == 0) {
              if ((*(float *)&pLVar5[1]._vptr_Layer != 0.0) ||
                 (NAN(*(float *)&pLVar5[1]._vptr_Layer))) {
                *(undefined4 *)&pLVar3[1].type.field_2 = 2;
                local_88.cstep = 0;
                local_88.data = (void *)0x0;
                local_88.refcount._0_4_ = 0;
                local_88.refcount._4_4_ = 0;
                local_88.elemsize._0_4_ = 0;
                local_88.elemsize._4_4_ = 0;
                local_88.elempack = 0;
                local_88.h = 0;
                local_88.d = 0;
                local_88.c = 0;
                local_88.allocator = (Allocator *)0x0;
                local_88.dims = 0;
                local_88.w = 0;
                ncnn::Mat::create(&local_88,1,4,(Allocator *)0x0);
                pMVar1 = (Mat *)((long)&pLVar3[1].type.field_2 + 8);
                piVar12 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                if (pMVar1 != &local_88) {
                  if (piVar12 != (int *)0x0) {
                    LOCK();
                    *piVar12 = *piVar12 + 1;
                    UNLOCK();
                  }
                  piVar12 = (int *)pLVar3[1].name._M_dataplus._M_p;
                  if (piVar12 != (int *)0x0) {
                    LOCK();
                    *piVar12 = *piVar12 + -1;
                    UNLOCK();
                    if (*piVar12 == 0) {
                      pvVar6 = *(void **)((long)&pLVar3[1].type.field_2 + 8);
                      plVar7 = *(long **)((long)&pLVar3[1].name.field_2 + 8);
                      if (plVar7 == (long *)0x0) {
                        if (pvVar6 != (void *)0x0) {
                          free(pvVar6);
                        }
                      }
                      else {
                        (**(code **)(*plVar7 + 0x18))();
                      }
                    }
                  }
                  *(void **)((long)&pLVar3[1].type.field_2 + 8) = local_88.data;
                  piVar12 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                  pLVar3[1].name._M_dataplus._M_p = (pointer)piVar12;
                  pLVar3[1].name._M_string_length =
                       CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                  *(int *)&pLVar3[1].name.field_2 = local_88.elempack;
                  *(Allocator **)((long)&pLVar3[1].name.field_2 + 8) = local_88.allocator;
                  *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data = local_88.dims;
                  *(int *)((long)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 4) = local_88.w;
                  *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish = local_88.h;
                  *(int *)((long)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + 4) = local_88.d;
                  *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage = local_88.c;
                  *(size_t *)
                   &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data = local_88.cstep;
                }
                if (piVar12 != (int *)0x0) {
                  LOCK();
                  *piVar12 = *piVar12 + -1;
                  UNLOCK();
                  if (*piVar12 == 0) {
                    if (local_88.allocator == (Allocator *)0x0) {
                      if (local_88.data != (void *)0x0) {
                        free(local_88.data);
                      }
                    }
                    else {
                      (*(local_88.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                *(undefined4 *)pMVar1->data = *(undefined4 *)&pLVar5[1]._vptr_Layer;
              }
              else {
                *(undefined4 *)&pLVar3[1].type.field_2 = 1;
              }
            }
            else {
              iVar10 = std::__cxx11::string::compare((char *)local_40);
              if (iVar10 == 0) {
                *(undefined4 *)&pLVar3[1].type.field_2 = 3;
                local_88.cstep = 0;
                local_88.data = (void *)0x0;
                local_88.refcount._0_4_ = 0;
                local_88.refcount._4_4_ = 0;
                local_88.elemsize._0_4_ = 0;
                local_88.elemsize._4_4_ = 0;
                local_88.elempack = 0;
                local_88.h = 0;
                local_88.d = 0;
                local_88.c = 0;
                local_88.allocator = (Allocator *)0x0;
                local_88.dims = 0;
                local_88.w = 0;
                ncnn::Mat::create(&local_88,2,4,(Allocator *)0x0);
                piVar12 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                if ((Mat *)((long)&pLVar3[1].type.field_2 + 8) != &local_88) {
                  if (piVar12 != (int *)0x0) {
                    LOCK();
                    *piVar12 = *piVar12 + 1;
                    UNLOCK();
                  }
                  piVar12 = (int *)pLVar3[1].name._M_dataplus._M_p;
                  if (piVar12 != (int *)0x0) {
                    LOCK();
                    *piVar12 = *piVar12 + -1;
                    UNLOCK();
                    if (*piVar12 == 0) {
                      pvVar6 = *(void **)((long)&pLVar3[1].type.field_2 + 8);
                      plVar7 = *(long **)((long)&pLVar3[1].name.field_2 + 8);
                      if (plVar7 == (long *)0x0) {
                        if (pvVar6 != (void *)0x0) {
                          free(pvVar6);
                        }
                      }
                      else {
                        (**(code **)(*plVar7 + 0x18))();
                      }
                    }
                  }
                  *(void **)((long)&pLVar3[1].type.field_2 + 8) = local_88.data;
                  piVar12 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                  pLVar3[1].name._M_dataplus._M_p = (pointer)piVar12;
                  pLVar3[1].name._M_string_length =
                       CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                  *(int *)&pLVar3[1].name.field_2 = local_88.elempack;
                  *(Allocator **)((long)&pLVar3[1].name.field_2 + 8) = local_88.allocator;
                  *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data = local_88.dims;
                  *(int *)((long)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 4) = local_88.w;
                  *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish = local_88.h;
                  *(int *)((long)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + 4) = local_88.d;
                  *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage = local_88.c;
                  *(size_t *)
                   &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data = local_88.cstep;
                }
                if (piVar12 != (int *)0x0) {
                  LOCK();
                  *piVar12 = *piVar12 + -1;
                  UNLOCK();
                  if (*piVar12 == 0) {
                    if (local_88.allocator == (Allocator *)0x0) {
LAB_0016741f:
                      if (local_88.data != (void *)0x0) {
                        free(local_88.data);
                      }
                    }
                    else {
                      (*(local_88.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
LAB_00167436:
                puVar8 = *(undefined4 **)((long)&pLVar3[1].type.field_2 + 8);
                *puVar8 = *(undefined4 *)&pLVar5[1]._vptr_Layer;
                puVar8[1] = *(undefined4 *)((long)&pLVar5[1]._vptr_Layer + 4);
              }
              else {
                iVar10 = std::__cxx11::string::compare((char *)psVar9);
                if (iVar10 == 0) {
                  *(undefined4 *)&pLVar3[1].type.field_2 = 4;
                }
                else {
                  iVar10 = std::__cxx11::string::compare((char *)psVar9);
                  if (iVar10 == 0) {
                    *(undefined4 *)&pLVar3[1].type.field_2 = 5;
                  }
                  else {
                    iVar10 = std::__cxx11::string::compare((char *)psVar9);
                    if (iVar10 == 0) {
                      *(undefined4 *)&pLVar3[1].type.field_2 = 6;
                      local_88.cstep = 0;
                      local_88.data = (void *)0x0;
                      local_88.refcount._0_4_ = 0;
                      local_88.refcount._4_4_ = 0;
                      local_88.elemsize._0_4_ = 0;
                      local_88.elemsize._4_4_ = 0;
                      local_88.elempack = 0;
                      local_88.h = 0;
                      local_88.d = 0;
                      local_88.c = 0;
                      local_88.allocator = (Allocator *)0x0;
                      local_88.dims = 0;
                      local_88.w = 0;
                      ncnn::Mat::create(&local_88,2,4,(Allocator *)0x0);
                      piVar12 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                      if ((Mat *)((long)&pLVar3[1].type.field_2 + 8) != &local_88) {
                        if (piVar12 != (int *)0x0) {
                          LOCK();
                          *piVar12 = *piVar12 + 1;
                          UNLOCK();
                        }
                        piVar12 = (int *)pLVar3[1].name._M_dataplus._M_p;
                        if (piVar12 != (int *)0x0) {
                          LOCK();
                          *piVar12 = *piVar12 + -1;
                          UNLOCK();
                          if (*piVar12 == 0) {
                            pvVar6 = *(void **)((long)&pLVar3[1].type.field_2 + 8);
                            plVar7 = *(long **)((long)&pLVar3[1].name.field_2 + 8);
                            if (plVar7 == (long *)0x0) {
                              if (pvVar6 != (void *)0x0) {
                                free(pvVar6);
                              }
                            }
                            else {
                              (**(code **)(*plVar7 + 0x18))();
                            }
                          }
                        }
                        *(void **)((long)&pLVar3[1].type.field_2 + 8) = local_88.data;
                        piVar12 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                        pLVar3[1].name._M_dataplus._M_p = (pointer)piVar12;
                        pLVar3[1].name._M_string_length =
                             CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                        *(int *)&pLVar3[1].name.field_2 = local_88.elempack;
                        *(Allocator **)((long)&pLVar3[1].name.field_2 + 8) = local_88.allocator;
                        *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data = local_88.dims;
                        *(int *)((long)&pLVar3[1].bottoms.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start + 4) = local_88.w;
                        *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish = local_88.h;
                        *(int *)((long)&pLVar3[1].bottoms.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 4) = local_88.d;
                        *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage = local_88.c;
                        *(size_t *)
                         &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data = local_88.cstep;
                      }
                      if (piVar12 != (int *)0x0) {
                        LOCK();
                        *piVar12 = *piVar12 + -1;
                        UNLOCK();
                        if (*piVar12 == 0) {
                          if (local_88.allocator == (Allocator *)0x0) goto LAB_0016741f;
                          (*(local_88.allocator)->_vptr_Allocator[3])();
                        }
                      }
                      goto LAB_00167436;
                    }
                  }
                }
              }
            }
            iVar10 = *(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar10;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar10].producer = (int)lVar14;
            std::__cxx11::string::_M_replace
                      ((ulong)local_40,0,(char *)(pLVar5->type)._M_string_length,0x52219a);
          }
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar15);
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_activation()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - Activation
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid" && layers[j]->type != "Mish" && layers[j]->type != "HardSwish")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - Activation to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_convolutiondepthwise_activation %s %s\n", convolutiondepthwise->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                convolutiondepthwise->activation_type = 1;
            }
            else
            {
                convolutiondepthwise->activation_type = 2;
                convolutiondepthwise->activation_params = ncnn::Mat(1);
                convolutiondepthwise->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            convolutiondepthwise->activation_type = 3;
            convolutiondepthwise->activation_params = ncnn::Mat(2);
            convolutiondepthwise->activation_params[0] = clip->min;
            convolutiondepthwise->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            convolutiondepthwise->activation_type = 4;
        }
        else if (activation->type == "Mish")
        {
            convolutiondepthwise->activation_type = 5;
        }
        else if (activation->type == "HardSwish")
        {
            ncnn::HardSwish* hardswish = (ncnn::HardSwish*)activation;

            convolutiondepthwise->activation_type = 6;
            convolutiondepthwise->activation_params = ncnn::Mat(2);
            convolutiondepthwise->activation_params[0] = hardswish->alpha;
            convolutiondepthwise->activation_params[1] = hardswish->beta;
        }

        int top_blob_index_final = activation->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}